

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O3

void btSolveL1T(btScalar *L,btScalar *B,int n,int lskip1)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  btScalar *pbVar8;
  float *pfVar9;
  uint uVar10;
  float *pfVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  float *pfVar17;
  int iVar18;
  int iVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  ulong uVar23;
  btScalar *pbVar24;
  float *pfVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  
  lVar16 = (long)((lskip1 + 1) * (n + -1));
  pfVar1 = L + lVar16;
  pfVar11 = B + (long)n + -1;
  uVar23 = 0;
  if (3 < n) {
    uVar15 = 0xfffffffd;
    lVar12 = (long)lskip1;
    pfVar25 = L + lVar12 * -4 + lVar16;
    iVar18 = 4;
    uVar23 = 0;
    pfVar21 = pfVar1;
    do {
      pfVar17 = pfVar11;
      if (uVar23 == 0) {
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        pfVar22 = pfVar1;
      }
      else {
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        pfVar22 = pfVar21;
        pfVar9 = pfVar25;
        iVar14 = iVar18;
        uVar10 = uVar15;
        do {
          uVar26 = uVar10;
          pfVar20 = pfVar9;
          fVar4 = *pfVar17;
          fVar5 = pfVar17[-3];
          fVar6 = pfVar17[-2];
          fVar7 = pfVar17[-1];
          pfVar9 = pfVar22 + (-3 - lVar12);
          pfVar2 = pfVar22 + lVar12 * -2 + -3;
          pfVar3 = pfVar22 + lVar12 * -3 + -3;
          fVar27 = fVar5 * *pfVar3 +
                   fVar6 * *pfVar2 + fVar7 * *pfVar9 + fVar4 * pfVar22[-3] + fVar27;
          fVar28 = fVar5 * pfVar3[1] +
                   fVar6 * pfVar2[1] + fVar7 * pfVar9[1] + fVar4 * pfVar22[-2] + fVar28;
          fVar29 = fVar5 * pfVar3[2] +
                   fVar6 * pfVar2[2] + fVar7 * pfVar9[2] + fVar4 * pfVar22[-1] + fVar29;
          fVar30 = fVar5 * pfVar3[3] +
                   fVar6 * pfVar2[3] + fVar7 * pfVar9[3] + fVar4 * *pfVar22 + fVar30;
          pfVar17 = pfVar17 + -4;
          iVar14 = iVar14 + -4;
          pfVar22 = pfVar22 + lVar12 * -4;
          pfVar9 = pfVar20 + lVar12 * -4;
          uVar10 = uVar26 - 4;
        } while (7 < iVar14);
        if (4 < iVar14) {
          do {
            fVar4 = *pfVar17;
            fVar27 = fVar27 + fVar4 * pfVar20[-3];
            fVar28 = fVar28 + fVar4 * pfVar20[-2];
            fVar29 = fVar29 + fVar4 * pfVar20[-1];
            fVar30 = fVar30 + fVar4 * *pfVar20;
            pfVar17 = pfVar17 + -1;
            uVar26 = uVar26 - 1;
            pfVar20 = pfVar20 + -lVar12;
            pfVar22 = pfVar20;
          } while (1 < uVar26);
        }
      }
      fVar30 = *pfVar17 - fVar30;
      *pfVar17 = fVar30;
      fVar29 = (pfVar17[-1] - fVar29) - pfVar22[-1] * fVar30;
      pfVar17[-1] = fVar29;
      fVar28 = ((pfVar17[-2] - fVar28) - pfVar22[-2] * fVar30) - pfVar22[-2 - lskip1] * fVar29;
      pfVar17[-2] = fVar28;
      pfVar17[-3] = (((pfVar17[-3] - fVar27) - fVar30 * pfVar22[-3]) - fVar29 * pfVar22[-3 - lskip1]
                    ) - fVar28 * pfVar22[lskip1 * -2 + -3];
      uVar23 = uVar23 + 4;
      iVar18 = iVar18 + 4;
      pfVar21 = pfVar21 + -4;
      uVar15 = uVar15 + 4;
      pfVar25 = pfVar25 + -4;
    } while (uVar23 <= n - 4);
  }
  if ((int)uVar23 < n) {
    uVar13 = uVar23 & 0xffffffff;
    iVar18 = (int)uVar23 + 4;
    pfVar21 = L + (lVar16 - uVar13);
    lVar16 = (long)lskip1;
    do {
      if (uVar13 < 4) {
        pfVar17 = pfVar1 + -uVar13;
        fVar27 = 0.0;
        iVar14 = (int)uVar13;
        pfVar25 = pfVar11;
      }
      else {
        fVar27 = 0.0;
        pbVar8 = B + (long)n + -2;
        pfVar25 = pfVar21;
        iVar19 = iVar18;
        do {
          iVar14 = iVar19;
          pfVar17 = pfVar25;
          pbVar24 = pbVar8;
          fVar27 = pfVar17[lVar16 * -2] * (float)((ulong)*(undefined8 *)(pbVar24 + -2) >> 0x20) +
                   *pfVar17 * (float)((ulong)*(undefined8 *)pbVar24 >> 0x20) + fVar27 +
                   pfVar17[-lVar16] * (float)*(undefined8 *)pbVar24 +
                   pfVar17[lVar16 * -3] * (float)*(undefined8 *)(pbVar24 + -2);
          iVar19 = iVar14 + -4;
          pbVar8 = pbVar24 + -4;
          pfVar25 = pfVar17 + lVar16 * -4;
        } while (7 < iVar19);
        pfVar17 = pfVar17 + lVar16 * -4;
        iVar14 = iVar14 + -8;
        pfVar25 = pbVar24 + -3;
      }
      if (0 < iVar14) {
        uVar15 = iVar14 + 1;
        do {
          fVar27 = fVar27 + *pfVar17 * *pfVar25;
          pfVar25 = pfVar25 + -1;
          uVar15 = uVar15 - 1;
          pfVar17 = pfVar17 + -lVar16;
        } while (1 < uVar15);
      }
      *pfVar25 = *pfVar25 - fVar27;
      uVar13 = uVar13 + 1;
      iVar18 = iVar18 + 1;
      pfVar21 = pfVar21 + -1;
    } while (uVar13 != (uint)n);
  }
  return;
}

Assistant:

void btSolveL1T (const btScalar *L, btScalar *B, int n, int lskip1)
{  
  /* declare variables - Z matrix, p and q vectors, etc */
  btScalar Z11,m11,Z21,m21,Z31,m31,Z41,m41,p1,q1,p2,p3,p4,*ex;
  const btScalar *ell;
  int lskip2,i,j;
//  int lskip3;
  /* special handling for L and B because we're solving L1 *transpose* */
  L = L + (n-1)*(lskip1+1);
  B = B + n-1;
  lskip1 = -lskip1;
  /* compute lskip values */
  lskip2 = 2*lskip1;
  //lskip3 = 3*lskip1;
  /* compute all 4 x 1 blocks of X */
  for (i=0; i <= n-4; i+=4) {
    /* compute all 4 x 1 block of X, from rows i..i+4-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    Z21=0;
    Z31=0;
    Z41=0;
    ell = L - i;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-4; j >= 0; j -= 4) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-1];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-2];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-3];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      ex -= 4;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 4;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      ex -= 1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
    p1 = ell[-1];
    Z21 = ex[-1] - Z21 - p1*Z11;
    ex[-1] = Z21;
    p1 = ell[-2];
    p2 = ell[-2+lskip1];
    Z31 = ex[-2] - Z31 - p1*Z11 - p2*Z21;
    ex[-2] = Z31;
    p1 = ell[-3];
    p2 = ell[-3+lskip1];
    p3 = ell[-3+lskip2];
    Z41 = ex[-3] - Z41 - p1*Z11 - p2*Z21 - p3*Z31;
    ex[-3] = Z41;
    /* end of outer loop */
  }
  /* compute rows at end that are not a multiple of block size */
  for (; i < n; i++) {
    /* compute all 1 x 1 block of X, from rows i..i+1-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    ell = L - i;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-4; j >= 0; j -= 4) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      Z11 += m11;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-1];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      Z11 += m11;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-2];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      Z11 += m11;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      ex -= 4;
      Z11 += m11;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 4;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      ex -= 1;
      Z11 += m11;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
  }
}